

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_permutations.c
# Opt level: O3

void ascon_permutation_12(ascon_sponge_t *sponge)

{
  ascon_round(sponge,0xf0);
  ascon_round(sponge,0xe1);
  ascon_round(sponge,0xd2);
  ascon_round(sponge,0xc3);
  ascon_round(sponge,0xb4);
  ascon_round(sponge,0xa5);
  ascon_round(sponge,0x96);
  ascon_round(sponge,0x87);
  ascon_round(sponge,'x');
  ascon_round(sponge,'i');
  ascon_round(sponge,'Z');
  ascon_round(sponge,'K');
  return;
}

Assistant:

ASCON_INLINE void
ascon_permutation_12(ascon_sponge_t* const sponge)
{
    ascon_round(sponge, ROUND_CONSTANT_01);
    ascon_round(sponge, ROUND_CONSTANT_02);
    ascon_round(sponge, ROUND_CONSTANT_03);
    ascon_round(sponge, ROUND_CONSTANT_04);
    ascon_round(sponge, ROUND_CONSTANT_05);
    ascon_round(sponge, ROUND_CONSTANT_06);
    ascon_round(sponge, ROUND_CONSTANT_07);
    ascon_round(sponge, ROUND_CONSTANT_08);
    ascon_round(sponge, ROUND_CONSTANT_09);
    ascon_round(sponge, ROUND_CONSTANT_10);
    ascon_round(sponge, ROUND_CONSTANT_11);
    ascon_round(sponge, ROUND_CONSTANT_12);
}